

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O2

bool __thiscall cmCTestUploadCommand::CheckArgumentKeyword(cmCTestUploadCommand *this,string *arg)

{
  bool bVar1;
  
  bVar1 = std::operator==(arg,"FILES");
  if (bVar1) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
  }
  else {
    bVar1 = std::operator==(arg,"QUIET");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
      (this->super_cmCTestHandlerCommand).Quiet = true;
    }
    else {
      bVar1 = std::operator==(arg,"CAPTURE_CMAKE_ERROR");
      if (!bVar1) {
        return false;
      }
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 4;
    }
  }
  return true;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentKeyword(std::string const& arg)
{
  if (arg == "FILES") {
    this->ArgumentDoing = ArgumentDoingFiles;
    return true;
  }
  if (arg == "QUIET") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
  }
  if (arg == "CAPTURE_CMAKE_ERROR") {
    this->ArgumentDoing = ArgumentDoingCaptureCMakeError;
    return true;
  }
  return false;
}